

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshalgo.c
# Opt level: O0

void psh_glyph_load_points(PSH_Glyph glyph,FT_Int dimension)

{
  FT_UInt local_2c;
  PSH_Point_conflict pPStack_28;
  FT_UInt count;
  PSH_Point_conflict point;
  FT_Vector *vec;
  FT_Int dimension_local;
  PSH_Glyph glyph_local;
  
  point = (PSH_Point_conflict)glyph->outline->points;
  pPStack_28 = glyph->points;
  for (local_2c = glyph->num_points; local_2c != 0; local_2c = local_2c - 1) {
    pPStack_28->flags2 = 0;
    pPStack_28->hint = (PSH_Hint_conflict)0x0;
    if (dimension == 0) {
      pPStack_28->org_u = (FT_Pos)point->prev;
      pPStack_28->org_v = (FT_Pos)point->next;
    }
    else {
      pPStack_28->org_u = (FT_Pos)point->next;
      pPStack_28->org_v = (FT_Pos)point->prev;
    }
    pPStack_28 = pPStack_28 + 1;
    point = (PSH_Point_conflict)&point->contour;
  }
  return;
}

Assistant:

static void
  psh_glyph_load_points( PSH_Glyph  glyph,
                         FT_Int     dimension )
  {
    FT_Vector*  vec   = glyph->outline->points;
    PSH_Point   point = glyph->points;
    FT_UInt     count = glyph->num_points;


    for ( ; count > 0; count--, point++, vec++ )
    {
      point->flags2 = 0;
      point->hint   = NULL;
      if ( dimension == 0 )
      {
        point->org_u = vec->x;
        point->org_v = vec->y;
      }
      else
      {
        point->org_u = vec->y;
        point->org_v = vec->x;
      }

#ifdef DEBUG_HINTER
      point->org_x = vec->x;
      point->org_y = vec->y;
#endif

    }
  }